

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_RegisterString::Test_Template_RegisterString(Test_Template_RegisterString *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, RegisterString) {
  ASSERT(Template::StringToTemplateCache("file1", "Some text"));
  Template* tpl = Template::GetTemplate("file1", STRIP_WHITESPACE);
  ASSERT(tpl);
  ASSERT(Template::GetTemplate("file1", STRIP_WHITESPACE) == tpl);

  ASSERT(Template::StringToTemplateCache("file2", "Top {{>INC}}"));

  TemplateDictionary dict("dict");
  string expected = "Some text";
  AssertExpandIs(tpl, &dict, expected, true);

  TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
  sub_dict->SetFilename("file1");
  tpl = Template::GetTemplate("file2", STRIP_WHITESPACE);
  expected = "Top Some text";
  AssertExpandIs(tpl, &dict, expected, true);
}